

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::has_root_path(Twine *path,Style style)

{
  StringRef SVar1;
  SmallString<128U> path_storage;
  SmallVectorImpl<char> local_a0;
  undefined1 local_90 [128];
  
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_90;
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_a0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  SVar1 = Twine::toStringRef(path,&local_a0);
  SVar1 = root_path(SVar1,style);
  SmallVectorImpl<char>::~SmallVectorImpl(&local_a0);
  return SVar1.Length != 0;
}

Assistant:

bool has_root_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !root_path(p, style).empty();
}